

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_count_gt.cpp
# Opt level: O0

void __thiscall IsingFreeEnergy_SquareCount0_Test::TestBody(IsingFreeEnergy_SquareCount0_Test *this)

{
  double *pdVar1;
  double *pdVar2;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> f_00;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> f_01;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> f_02;
  fvar<double,_2UL> fVar3;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> fVar4;
  fvar<double,_2UL> beta_00;
  fvar<double,_2UL> beta_01;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> fVar5;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> fVar6;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> f_03;
  fvar<double,_2UL> beta_02;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> h_00;
  fvar<double,_2UL> beta_03;
  bool bVar7;
  undefined1 uVar8;
  __tuple_element_t<0UL,_tuple<fvar<double,_2UL>,_fvar<fvar<double,_2UL>,_0UL>_>_> *p_Var9;
  __tuple_element_t<1UL,_tuple<fvar<double,_2UL>,_fvar<fvar<double,_2UL>,_0UL>_>_> *p_Var10;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
  f;
  __tuple_element_t<1UL,_tuple<fvar<double,_2UL>,_fvar<fvar<double,_2UL>,_0UL>_>_> *h;
  __tuple_element_t<0UL,_tuple<fvar<double,_2UL>,_fvar<fvar<double,_2UL>,_0UL>_>_> *beta;
  tuple<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
  vars;
  double t;
  double Jy;
  double Jx;
  uint Ly;
  uint Lx;
  double local_4c8;
  int *in_stack_fffffffffffffb40;
  AssertHelper *pAVar11;
  double *in_stack_fffffffffffffb48;
  char *pcVar12;
  int iVar13;
  char *pcVar14;
  Type TVar15;
  AssertHelper *pAVar16;
  AssertHelper *this_00;
  char *in_stack_fffffffffffffb80;
  double in_stack_fffffffffffffbb0;
  double in_stack_fffffffffffffbb8;
  undefined8 in_stack_fffffffffffffbc0;
  AssertionResult *pAVar17;
  undefined7 in_stack_fffffffffffffbc8;
  undefined1 in_stack_fffffffffffffbcf;
  AssertHelper *in_stack_fffffffffffffbd0;
  double in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc80;
  AssertionResult local_328 [2];
  double local_308;
  double dStack_300;
  double local_2f8;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double local_2c8;
  AssertHelper *pAStack_2c0;
  undefined8 local_2b8;
  char *pcStack_2b0;
  double local_2a8;
  char *pcStack_2a0;
  AssertionResult local_278 [2];
  double local_258;
  double dStack_250;
  double local_248;
  double local_238;
  double dStack_230;
  double local_228;
  double local_218;
  AssertHelper *pAStack_210;
  undefined8 local_208;
  char *pcStack_200;
  double local_1f8;
  char *pcStack_1f0;
  AssertionResult local_1c8 [3];
  double local_198;
  double dStack_190;
  double local_188;
  double local_178;
  double dStack_170;
  double local_168;
  double local_158;
  AssertHelper *pAStack_150;
  undefined8 local_148;
  char *rhs_value;
  double dVar18;
  char *rhs_expression;
  AssertionResult local_108;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  AssertHelper *pAStack_b8;
  undefined8 local_b0;
  char *pcStack_a8;
  double local_a0;
  char *pcStack_98;
  char *in_stack_ffffffffffffff70;
  char *pcVar19;
  AssertHelper *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 uVar20;
  array<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_1UL>
  in_stack_ffffffffffffffa8;
  
  convert<double>(in_stack_fffffffffffffb80);
  convert<double>(in_stack_fffffffffffffb80);
  dVar18 = convert<double>(in_stack_fffffffffffffb80);
  dVar18 = 1.0 / dVar18;
  uVar20 = 0;
  boost::math::differentiation::autodiff_v1::make_ftuple<double,2ul,2ul,double,int>
            (in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  p_Var9 = std::
           get<0ul,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
                     ((tuple<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
                       *)0x10bb9f);
  p_Var10 = std::
            get<1ul,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
                      ((tuple<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
                        *)0x10bbb4);
  local_c8 = (p_Var9->v)._M_elems[2];
  local_4c8 = (p_Var9->v)._M_elems[0];
  dStack_d0 = (p_Var9->v)._M_elems[1];
  local_e8 = (p_Var10->v)._M_elems[0].v._M_elems[2];
  local_f8 = (p_Var10->v)._M_elems[0].v._M_elems[0];
  dStack_f0 = (p_Var10->v)._M_elems[0].v._M_elems[1];
  beta_03.v._M_elems[1]._0_4_ = in_stack_ffffffffffffff98;
  beta_03.v._M_elems[0] = (double)p_Var9;
  beta_03.v._M_elems[1]._4_4_ = uVar20;
  beta_03.v._M_elems[2] = dVar18;
  local_d8 = local_4c8;
  ising::free_energy::square::
  finite_count<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
             (double)in_stack_ffffffffffffff70,beta_03,
             (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>)
             in_stack_ffffffffffffffa8._M_elems[0].v._M_elems);
  f_00.v._M_elems[2].v._M_elems[1]._4_4_ = in_stack_ffffffffffffff84;
  f_00.v._M_elems[2].v._M_elems[1]._0_4_ = in_stack_ffffffffffffff80;
  local_148 = local_b0;
  local_158 = local_c0;
  pAStack_150 = pAStack_b8;
  local_168 = (p_Var9->v)._M_elems[2];
  local_178 = (p_Var9->v)._M_elems[0];
  pdVar1 = (p_Var9->v)._M_elems + 1;
  dStack_170 = *pdVar1;
  local_188 = (p_Var10->v)._M_elems[0].v._M_elems[2];
  local_198 = (p_Var10->v)._M_elems[0].v._M_elems[0];
  pdVar2 = (p_Var10->v)._M_elems[0].v._M_elems + 1;
  dStack_190 = *pdVar2;
  TVar15 = (Type)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  iVar13 = (int)((ulong)local_a0 >> 0x20);
  local_4c8 = local_c0;
  f_00.v._M_elems[0].v._M_elems[1] = (double)local_b0;
  f_00.v._M_elems[0].v._M_elems[0] = (double)pAStack_b8;
  f_00.v._M_elems[0].v._M_elems[2] = (double)pcStack_a8;
  f_00.v._M_elems[1].v._M_elems[0]._0_4_ = SUB84(local_a0,0);
  f_00.v._M_elems[1].v._M_elems[0]._4_4_ = iVar13;
  f_00.v._M_elems[1].v._M_elems[1] = (double)pcStack_98;
  f_00.v._M_elems[1].v._M_elems[2]._0_4_ = (int)in_stack_ffffffffffffff70;
  f_00.v._M_elems[1].v._M_elems[2]._4_4_ = TVar15;
  f_00.v._M_elems[2].v._M_elems[0] = (double)in_stack_ffffffffffffff78;
  f_00.v._M_elems[2].v._M_elems[2] = local_178;
  fVar3.v._M_elems[2] = local_198;
  fVar3.v._M_elems._0_16_ = *(undefined1 (*) [16])pdVar1;
  fVar4.v._M_elems[0].v._M_elems[2] = in_stack_fffffffffffffbb0;
  fVar4.v._M_elems[0].v._M_elems._0_16_ = *(undefined1 (*) [16])pdVar2;
  pAVar11 = pAStack_b8;
  pcVar12 = pcStack_a8;
  pcVar14 = pcStack_98;
  rhs_value = pcStack_a8;
  dVar18 = local_a0;
  rhs_expression = pcStack_98;
  pcVar19 = in_stack_ffffffffffffff70;
  pAVar16 = in_stack_ffffffffffffff78;
  ising::free_energy::
  free_energy<boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (f_00,fVar3,fVar4);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_ffffffffffffff70,rhs_expression,dVar18,(double)rhs_value);
  bVar7 = testing::AssertionResult::operator_cast_to_bool(&local_108);
  if (!bVar7) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff78);
    testing::AssertionResult::failure_message((AssertionResult *)0x10bded);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff78,TVar15,pcVar14,iVar13,pcVar12);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,
               (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
    testing::internal::AssertHelper::~AssertHelper(pAVar11);
    testing::Message::~Message((Message *)0x10be50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bea8);
  f_01.v._M_elems[1].v._M_elems[0]._4_4_ = in_stack_ffffffffffffff84;
  f_01.v._M_elems[1].v._M_elems[0]._0_4_ = in_stack_ffffffffffffff80;
  local_1f8 = local_a0;
  pcStack_1f0 = pcStack_98;
  local_208 = local_b0;
  pcStack_200 = pcStack_a8;
  local_218 = local_c0;
  pAStack_210 = pAStack_b8;
  local_228 = (p_Var9->v)._M_elems[2];
  local_238 = (p_Var9->v)._M_elems[0];
  dStack_230 = (p_Var9->v)._M_elems[1];
  local_248 = (p_Var10->v)._M_elems[0].v._M_elems[2];
  local_258 = (p_Var10->v)._M_elems[0].v._M_elems[0];
  dStack_250 = (p_Var10->v)._M_elems[0].v._M_elems[1];
  TVar15 = (Type)((ulong)pcVar19 >> 0x20);
  iVar13 = (int)((ulong)local_a0 >> 0x20);
  local_4c8 = local_c0;
  f_01.v._M_elems[0].v._M_elems[1]._0_4_ = (int)pcVar19;
  f_01.v._M_elems[0].v._M_elems[0] = (double)pcStack_98;
  f_01.v._M_elems[0].v._M_elems[1]._4_4_ = TVar15;
  f_01.v._M_elems[0].v._M_elems[2] = (double)pAVar16;
  f_01.v._M_elems[1].v._M_elems[1] = local_238;
  f_01.v._M_elems[1].v._M_elems[2] = dStack_230;
  f_01.v._M_elems[2].v._M_elems[0] = local_228;
  f_01.v._M_elems[2].v._M_elems[1] = local_258;
  f_01.v._M_elems[2].v._M_elems[2] = dStack_250;
  beta_00.v._M_elems[1] = in_stack_fffffffffffffbb0;
  beta_00.v._M_elems[0] = local_248;
  beta_00.v._M_elems[2] = in_stack_fffffffffffffbb8;
  fVar5.v._M_elems[0].v._M_elems[1]._0_7_ = in_stack_fffffffffffffbc8;
  fVar5.v._M_elems[0].v._M_elems[0] = (double)in_stack_fffffffffffffbc0;
  fVar5.v._M_elems[0].v._M_elems[1]._7_1_ = in_stack_fffffffffffffbcf;
  fVar5.v._M_elems[0].v._M_elems[2] = (double)in_stack_fffffffffffffbd0;
  pAVar11 = pAStack_b8;
  pcVar12 = pcStack_a8;
  pcVar14 = pcStack_98;
  this_00 = pAVar16;
  ising::free_energy::
  energy<boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (f_01,beta_00,fVar5);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_ffffffffffffff70,rhs_expression,dVar18,(double)rhs_value);
  bVar7 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar7) {
    testing::Message::Message((Message *)pAVar16);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c04e);
    testing::internal::AssertHelper::AssertHelper(pAVar16,TVar15,pcVar14,iVar13,pcVar12);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,
               (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
    testing::internal::AssertHelper::~AssertHelper(pAVar11);
    testing::Message::~Message((Message *)0x10c0b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c109);
  f_02.v._M_elems[0].v._M_elems[1]._4_4_ = in_stack_ffffffffffffff84;
  f_02.v._M_elems[0].v._M_elems[1]._0_4_ = in_stack_ffffffffffffff80;
  local_2a8 = local_a0;
  pcStack_2a0 = pcStack_98;
  local_2b8 = local_b0;
  pcStack_2b0 = pcStack_a8;
  local_2c8 = local_c0;
  pAStack_2c0 = pAStack_b8;
  local_2d8 = (p_Var9->v)._M_elems[2];
  local_2e8 = (p_Var9->v)._M_elems[0];
  dStack_2e0 = (p_Var9->v)._M_elems[1];
  local_2f8 = (p_Var10->v)._M_elems[0].v._M_elems[2];
  local_308 = (p_Var10->v)._M_elems[0].v._M_elems[0];
  dStack_300 = (p_Var10->v)._M_elems[0].v._M_elems[1];
  TVar15 = (Type)((ulong)pcVar19 >> 0x20);
  iVar13 = (int)((ulong)local_a0 >> 0x20);
  local_4c8 = local_c0;
  f_02.v._M_elems[0].v._M_elems[0] = (double)this_00;
  f_02.v._M_elems[0].v._M_elems[2] = local_2e8;
  f_02.v._M_elems[1].v._M_elems[0] = dStack_2e0;
  f_02.v._M_elems[1].v._M_elems[1] = local_2d8;
  f_02.v._M_elems[1].v._M_elems[2] = local_308;
  f_02.v._M_elems[2].v._M_elems[0] = dStack_300;
  f_02.v._M_elems[2].v._M_elems[1] = local_2f8;
  f_02.v._M_elems[2].v._M_elems[2] = in_stack_fffffffffffffbb0;
  beta_01.v._M_elems[1] = (double)in_stack_fffffffffffffbc0;
  beta_01.v._M_elems[0] = in_stack_fffffffffffffbb8;
  beta_01.v._M_elems[2]._0_7_ = in_stack_fffffffffffffbc8;
  beta_01.v._M_elems[2]._7_1_ = in_stack_fffffffffffffbcf;
  fVar6.v._M_elems[0].v._M_elems[1] = (double)&local_4c8;
  fVar6.v._M_elems[0].v._M_elems[0] = (double)in_stack_fffffffffffffbd0;
  fVar6.v._M_elems[0].v._M_elems[2] = in_stack_fffffffffffffbe0;
  pAVar11 = pAStack_b8;
  pcVar12 = pcStack_a8;
  pcVar14 = pcStack_98;
  pAVar16 = this_00;
  ising::free_energy::
  specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (f_02,beta_01,fVar6);
  pAVar17 = local_278;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_ffffffffffffff70,rhs_expression,dVar18,(double)rhs_value);
  bVar7 = testing::AssertionResult::operator_cast_to_bool(pAVar17);
  if (!bVar7) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffbd0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10c2af);
    testing::internal::AssertHelper::AssertHelper(this_00,TVar15,pcVar14,iVar13,pcVar12);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,
               (Message *)CONCAT17(in_stack_fffffffffffffbcf,in_stack_fffffffffffffbc8));
    testing::internal::AssertHelper::~AssertHelper(pAVar11);
    testing::Message::~Message((Message *)0x10c312);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c36a);
  TVar15 = (Type)((ulong)pcVar19 >> 0x20);
  iVar13 = (int)((ulong)local_a0 >> 0x20);
  local_4c8 = local_c0;
  f_03.v._M_elems[0].v._M_elems[2] = (double)in_stack_fffffffffffffc60;
  f_03.v._M_elems[0].v._M_elems._0_16_ =
       *(undefined1 (*) [16])((p_Var10->v)._M_elems[0].v._M_elems + 1);
  f_03.v._M_elems[1].v._M_elems[0] = (p_Var9->v)._M_elems[0];
  f_03.v._M_elems[1].v._M_elems[1] = (p_Var9->v)._M_elems[1];
  f_03.v._M_elems[1].v._M_elems[2] = (p_Var9->v)._M_elems[2];
  f_03.v._M_elems[2].v._M_elems[0] = (double)in_stack_fffffffffffffc80;
  f_03.v._M_elems[2].v._M_elems[1] = local_c0;
  f_03.v._M_elems[2].v._M_elems[2] = (double)pAStack_b8;
  beta_02.v._M_elems[1] = (double)pcStack_a8;
  beta_02.v._M_elems[0] = (double)local_b0;
  beta_02.v._M_elems[2] = local_a0;
  h_00.v._M_elems[0].v._M_elems[1] = (double)pcVar19;
  h_00.v._M_elems[0].v._M_elems[0] = (double)pcStack_98;
  h_00.v._M_elems[0].v._M_elems[2] = (double)pAVar16;
  ising::free_energy::
  magnetization2<boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
            (f_03,beta_02,h_00);
  pAVar17 = local_328;
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_ffffffffffffff70,rhs_expression,dVar18,(double)rhs_value);
  uVar8 = testing::AssertionResult::operator_cast_to_bool(pAVar17);
  if (!(bool)uVar8) {
    testing::Message::Message((Message *)pAVar16);
    testing::AssertionResult::failure_message((AssertionResult *)0x10c510);
    testing::internal::AssertHelper::AssertHelper(pAVar16,TVar15,pcStack_98,iVar13,pcStack_a8);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,(Message *)CONCAT17(uVar8,in_stack_fffffffffffffbc8));
    testing::internal::AssertHelper::~AssertHelper(pAStack_b8);
    testing::Message::~Message((Message *)0x10c56d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c5c2);
  return;
}

Assistant:

TEST(IsingFreeEnergy, SquareCount0) {
  typedef double real_t;
  unsigned Lx = 4;
  unsigned Ly = 4;
  auto Jx = convert<real_t>("1.5");
  auto Jy = convert<real_t>("2.5");
  auto t = convert<real_t>("2");
  auto vars = boost::math::differentiation::make_ftuple<real_t, 2, 2>(1 / t, 0);
  auto& beta = std::get<0>(vars);
  auto& h = std::get<1>(vars);
  auto f = square::finite_count(Lx, Ly, Jx, Jy, beta, h);
  EXPECT_DOUBLE_EQ(-4.087359662653047e+00, free_energy(f, beta, h));
  EXPECT_DOUBLE_EQ(-3.994108759068211e+00, energy(f, beta, h));
  EXPECT_DOUBLE_EQ(2.452622208849045e-02, specific_heat(f, beta, h));
  EXPECT_DOUBLE_EQ(1.597700713244840e+01, magnetization2(f, beta, h));
}